

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O1

MPP_RET hal_h264e_vepu541_gen_regs(void *hal,HalEncTask *task)

{
  MppBuffer *buffer;
  MppBufferGroup *group;
  MppFrameFormat format;
  long lVar1;
  EncRcTask *pEVar2;
  EncRcTask *pEVar3;
  MppDev pvVar4;
  MppPacket s;
  MppFrame frame;
  HalBufs bufs;
  MppEncROICfg *roi;
  int *piVar5;
  byte bVar6;
  MPP_RET MVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  RK_U32 RVar11;
  RK_U32 RVar12;
  int iVar13;
  RK_U32 offset;
  RK_S32 RVar14;
  int iVar15;
  MppEncROICfg2 *cfg_1;
  VepuRgb2YuvCfg *pVVar16;
  MppBuffer pvVar17;
  undefined4 extraout_var;
  size_t sVar18;
  HalBuf *pHVar19;
  HalBuf *pHVar20;
  void *pvVar21;
  MppEncROIRegion *region;
  undefined2 uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  Vepu541Fmt VVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  RK_U32 *pRVar32;
  RK_U32 *pRVar33;
  MppBuffer pvVar34;
  ulong uVar35;
  long lVar36;
  short sVar37;
  int iVar38;
  bool bVar39;
  byte bVar40;
  VepuFmtCfg cfg;
  VepuFmtCfg local_80;
  undefined8 local_58;
  int *local_50;
  undefined8 local_48;
  void *local_40;
  MppFrameFormat local_34;
  
  bVar40 = 0;
  lVar36 = *hal;
  local_50 = *(int **)((long)hal + 0x38);
  lVar30 = *(long *)((long)hal + 0x40);
  lVar1 = *(long *)((long)hal + 0x48);
  pEVar2 = task->rc_task;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_gen_regs",hal);
  }
  local_40 = (void *)((long)hal + 0x1b8);
  if (((byte)hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","frame %d generate regs now","hal_h264e_vepu541_gen_regs",
               (ulong)**(uint **)((long)hal + 0x50));
  }
  memset(local_40,0,0x348);
  iVar9 = *(int *)((long)hal + 0x10);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_normal");
  }
  *(uint *)((long)hal + 0x1bc) = *(uint *)((long)hal + 0x1bc) & 0xfff8fc00 | 0x50100;
  *(byte *)((long)hal + 0x1c0) = *(byte *)((long)hal + 0x1c0) & 0xfc;
  *(undefined4 *)((long)hal + 0x1c4) = 0;
  *(uint *)((long)hal + 0x1c8) = *(uint *)((long)hal + 0x1c8) & 0xfffffe00 | 0xff;
  *(uint *)((long)hal + 0x1cc) = *(uint *)((long)hal + 0x1cc) & 0xfffffe00;
  *(undefined4 *)((long)hal + 0x1f0) = 0;
  *(uint *)((long)hal + 500) = *(uint *)((long)hal + 500) & 0xf0000001 | 0x8007000;
  uVar8 = 0xff00ff7f;
  if (iVar9 == 0) {
    uVar8 = 0xffffff00;
  }
  *(uint *)((long)hal + 0x1f8) = uVar8 & *(uint *)((long)hal + 0x1f8) | 0x80;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_normal");
  }
  lVar29 = *hal;
  format = *(MppFrameFormat *)(lVar29 + 0x24);
  MVar7 = vepu541_set_fmt(&local_80,format);
  VVar28 = local_80.format;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_prep");
  }
  if (MVar7 != MPP_OK) {
    return MVar7;
  }
  local_58 = (ulong)local_58._4_4_ << 0x20;
  uVar23 = (*(int *)(lVar29 + 0xc) + 0xfU >> 3 & 0x1fe) - 1 & 0x1ff;
  uVar8 = *(uint *)((long)hal + 0x1e8);
  *(uint *)((long)hal + 0x1e8) = uVar8 & 0xfffffe00 | uVar23;
  uVar24 = ((*(int *)(lVar29 + 0xc) + 0xfU & 0x30) - *(int *)(lVar29 + 0xc) & 0x3f) << 10;
  *(uint *)((long)hal + 0x1e8) = uVar8 & 0xffff0200 | uVar23 | uVar24;
  uVar25 = (*(int *)(lVar29 + 0x10) * 0x2000 + 0x1e000U & 0x1fe0000) + 0x1ff0000 & 0x1ff0000;
  *(uint *)((long)hal + 0x1e8) = uVar8 & 0xfe000200 | uVar23 | uVar24 | uVar25;
  *(uint *)((long)hal + 0x1e8) =
       uVar8 & 0x2000200 | uVar23 | uVar24 | uVar25 |
       ((*(int *)(lVar29 + 0x10) + 0xfU & 0x30) - *(int *)(lVar29 + 0x10)) * 0x4000000;
  *(uint *)((long)hal + 500) =
       *(uint *)((long)hal + 500) & 0xffffff0f | (local_80.src_endian & 0xf) << 4;
  uVar8 = (*(uint *)((long)hal + 0x1fc) & 0xffffffc3) +
          (VVar28 & (VEPU580_FMT_BUTT|VEPU541_FMT_BGR888)) * 4;
  *(uint *)((long)hal + 0x1fc) = uVar8;
  *(uint *)((long)hal + 0x1fc) = uVar8 & 0xfffffffe | local_80.alpha_swap & 1;
  uVar8 = (uVar8 & 0xfffffffc | local_80.alpha_swap & 1) + (local_80.rbuv_swap & 1) * 2;
  *(uint *)((long)hal + 0x1fc) = uVar8;
  *(uint *)((long)hal + 0x1fc) =
       (uint)(format == MPP_FMT_YUV400) << 7 | (local_80.src_range & 1) << 6 | uVar8 & 0xffffff3f;
  if ((format & 0xf00000) == MPP_FMT_YUV420SP) {
    uVar8 = *(uint *)(lVar29 + 0x14);
    if (uVar8 == 0) {
      uVar8 = *(uint *)(lVar29 + 0xc);
    }
  }
  else {
    uVar8 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (uVar8 == 0) {
      uVar8 = *(int *)(lVar29 + 0x14) + 0xfU & 0xfffffff0;
    }
  }
  uVar23 = (int)uVar8 / 2;
  if ((VVar28 & ~VEPU541_FMT_BGR565) == VEPU541_FMT_YUV422SP) {
    uVar23 = uVar8;
  }
  if (VVar28 < VEPU541_FMT_NONE) {
    pVVar16 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar29 + 0x34),
                              *(MppFrameColorSpace *)(lVar29 + 0x28));
    if (((byte)hal_h264e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","input color range %d colorspace %d","setup_vepu541_prep",
                 (ulong)*(uint *)(lVar29 + 0x34),(ulong)*(uint *)(lVar29 + 0x28));
    }
    uVar25 = (ushort)(pVVar16->_2y).b_coeff & 0x1ff;
    uVar24 = *(uint *)((long)hal + 0x200);
    *(uint *)((long)hal + 0x200) = uVar24 & 0xfffffe00 | uVar25;
    uVar31 = ((ushort)(pVVar16->_2y).g_coeff & 0x1ff) << 9;
    *(uint *)((long)hal + 0x200) = uVar24 & 0xfffc0000 | uVar25 | uVar31;
    *(uint *)((long)hal + 0x200) =
         uVar24 & 0xf8000000 | uVar25 | uVar31 | ((ushort)(pVVar16->_2y).r_coeff & 0x1ff) << 0x12;
    uVar25 = (ushort)(pVVar16->_2u).b_coeff & 0x1ff;
    uVar24 = *(uint *)((long)hal + 0x204);
    *(uint *)((long)hal + 0x204) = uVar24 & 0xfffffe00 | uVar25;
    uVar31 = ((ushort)(pVVar16->_2u).g_coeff & 0x1ff) << 9;
    *(uint *)((long)hal + 0x204) = uVar24 & 0xfffc0000 | uVar25 | uVar31;
    *(uint *)((long)hal + 0x204) =
         uVar24 & 0xf8000000 | uVar25 | uVar31 | ((ushort)(pVVar16->_2u).r_coeff & 0x1ff) << 0x12;
    uVar25 = (ushort)(pVVar16->_2v).b_coeff & 0x1ff;
    uVar24 = *(uint *)((long)hal + 0x208);
    *(uint *)((long)hal + 0x208) = uVar24 & 0xfffffe00 | uVar25;
    uVar31 = ((ushort)(pVVar16->_2v).g_coeff & 0x1ff) << 9;
    *(uint *)((long)hal + 0x208) = uVar24 & 0xfffc0000 | uVar25 | uVar31;
    *(uint *)((long)hal + 0x208) =
         uVar24 & 0xf8000000 | uVar25 | uVar31 | ((ushort)(pVVar16->_2v).r_coeff & 0x1ff) << 0x12;
    uVar25 = ((ushort)(pVVar16->_2y).offset & 0x1f) << 0x10;
    uVar24 = *(uint *)((long)hal + 0x20c);
    *(uint *)((long)hal + 0x20c) = uVar24 & 0xffe0ffff | uVar25;
    uVar24 = uVar24 & 0xffe000ff | uVar25 | ((ushort)(pVVar16->_2u).offset & 0xff) << 8;
    *(uint *)((long)hal + 0x20c) = uVar24;
    *(uint *)((long)hal + 0x20c) = CONCAT31((int3)(uVar24 >> 8),(char)(pVVar16->_2v).offset);
    if (((byte)hal_h264e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","use color range %d colorspace %d","setup_vepu541_prep",
                 (ulong)pVVar16->dst_range,(ulong)pVVar16->color);
    }
  }
  else {
    uVar25 = *local_80.weight & 0x1ff;
    uVar24 = *(uint *)((long)hal + 0x200);
    *(uint *)((long)hal + 0x200) = uVar24 & 0xfffffe00 | uVar25;
    uVar31 = (local_80.weight[1] & 0x1ffU) << 9;
    *(uint *)((long)hal + 0x200) = uVar24 & 0xfffc0000 | uVar25 | uVar31;
    *(uint *)((long)hal + 0x200) =
         uVar24 & 0xf8000000 | uVar25 | uVar31 | (local_80.weight[2] & 0x1ffU) << 0x12;
    uVar25 = local_80.weight[3] & 0x1ff;
    uVar24 = *(uint *)((long)hal + 0x204);
    *(uint *)((long)hal + 0x204) = uVar24 & 0xfffffe00 | uVar25;
    uVar31 = (local_80.weight[4] & 0x1ffU) << 9;
    *(uint *)((long)hal + 0x204) = uVar24 & 0xfffc0000 | uVar25 | uVar31;
    *(uint *)((long)hal + 0x204) =
         uVar24 & 0xf8000000 | uVar25 | uVar31 | (local_80.weight[5] & 0x1ffU) << 0x12;
    uVar25 = local_80.weight[6] & 0x1ff;
    uVar24 = *(uint *)((long)hal + 0x208);
    *(uint *)((long)hal + 0x208) = uVar24 & 0xfffffe00 | uVar25;
    uVar31 = (local_80.weight[7] & 0x1ffU) << 9;
    *(uint *)((long)hal + 0x208) = uVar24 & 0xfffc0000 | uVar25 | uVar31;
    *(uint *)((long)hal + 0x208) =
         uVar24 & 0xf8000000 | uVar25 | uVar31 | (local_80.weight[8] & 0x1ffU) << 0x12;
    uVar25 = (*local_80.offset & 0x1fU) << 0x10;
    uVar24 = *(uint *)((long)hal + 0x20c);
    *(uint *)((long)hal + 0x20c) = uVar24 & 0xffe0ffff | uVar25;
    uVar24 = uVar24 & 0xffe000ff | uVar25 | (local_80.offset[1] & 0xffU) << 8;
    *(uint *)((long)hal + 0x20c) = uVar24;
    *(uint *)((long)hal + 0x20c) = CONCAT31((int3)(uVar24 >> 8),(char)local_80.offset[2]);
  }
  uVar24 = *(uint *)((long)hal + 0x210);
  uVar25 = (uint)((format & 0xf00000) != MPP_FMT_YUV420SP) << 0x1e;
  *(uint *)((long)hal + 0x210) = uVar24 & 0xbfffffff | uVar25;
  *(uint *)((long)hal + 0x2cc) = uVar23 << 0x10 | uVar8 & 0xffff;
  uVar8 = (uint)(0 < *(int *)(lVar29 + 0x58)) << 0x1a;
  *(uint *)((long)hal + 0x210) = uVar24 & 0xbbffffff | uVar25 | uVar8;
  *(uint *)((long)hal + 0x210) =
       (uVar24 & 0x83ffffff | uVar25 | uVar8) + (*(uint *)(lVar29 + 0x50) & 3) * 0x8000000 +
       0x20000000;
  *(byte *)((long)hal + 0x217) = *(byte *)((long)hal + 0x217) | 0x80;
  *(uint *)((long)hal + 0x2c8) = *(uint *)((long)hal + 0x2c8) & 0xe000e000;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_prep");
  }
  piVar5 = local_50;
  if ((MPP_RET)local_58 != MPP_OK) {
    return (MPP_RET)local_58;
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_codec");
  }
  uVar8 = *(uint *)((long)hal + 0x1ec);
  uVar23 = *(uint *)((long)hal + 0x354);
  *(uint *)((long)hal + 0x1ec) = uVar8 & 0xfffffffe;
  uVar8 = (uVar8 & 0xffffffea) + (uint)(0 < *(int *)(lVar1 + 0x20)) * 4 + 0x10;
  *(uint *)((long)hal + 0x1ec) = uVar8;
  *(uint *)((long)hal + 0x1ec) = uVar8 & 0x7f7fffde | (uint)(*(int *)(lVar1 + 0x2c) != 2) << 5;
  uVar8 = *(uint *)(lVar1 + 0x20) & 3;
  *(uint *)((long)hal + 0x354) = uVar23 & 0xfffffffc | uVar8;
  *(uint *)((long)hal + 0x354) =
       (uVar23 & 0xffffff80 | uVar8) + (*(uint *)(lVar1 + 0x24) & 0x1f) * 4;
  uVar8 = *(uint *)((long)hal + 0x358);
  uVar23 = piVar5[10] & 0xf;
  *(uint *)((long)hal + 0x358) = uVar8 & 0xfffffff0 | uVar23;
  uVar24 = (piVar5[0x12] & 1U) << 4;
  *(uint *)((long)hal + 0x358) = uVar8 & 0xffffffe0 | uVar23 | uVar24;
  *(uint *)((long)hal + 0x358) = uVar8 & 0xfffffe00 | uVar23 | uVar24 | (piVar5[0xc] & 0xfU) << 5;
  uVar8 = *(uint *)((long)hal + 0x35c);
  uVar23 = *(uint *)(lVar30 + 8) & 1;
  *(uint *)((long)hal + 0x35c) = uVar8 & 0xfffffffe | uVar23;
  uVar8 = (uVar8 & 0xfffffffc | uVar23) + (*(uint *)(lVar30 + 0x44) & 1) * 2;
  *(uint *)((long)hal + 0x35c) = uVar8;
  uVar8 = (uVar8 & 0xfffffffb) + (*(uint *)(lVar30 + 0x3c) & 1) * 4;
  *(uint *)((long)hal + 0x35c) = uVar8;
  uVar23 = *(int *)(lVar30 + 0x14) * 8 + 0x18U & 0x18;
  *(uint *)((long)hal + 0x35c) = uVar8 & 0xffffffe7 | uVar23;
  uVar24 = *(int *)(lVar30 + 0x18) * 0x20 + 0x60U & 0x60;
  *(uint *)((long)hal + 0x35c) = uVar8 & 0xffffff87 | uVar23 | uVar24;
  uVar25 = (*(uint *)(lVar30 + 0x24) & 0x3f) << 7;
  *(uint *)((long)hal + 0x35c) = uVar8 & 0xffffe007 | uVar23 | uVar24 | uVar25;
  uVar31 = (*(uint *)(lVar30 + 0x2c) & 0x1f) << 0xd;
  *(uint *)((long)hal + 0x35c) = uVar8 & 0xfffc0007 | uVar23 | uVar24 | uVar25 | uVar31;
  uVar26 = (*(uint *)(lVar30 + 0x34) & 0x1f) << 0x12;
  *(uint *)((long)hal + 0x35c) = uVar8 & 0xff800007 | uVar23 | uVar24 | uVar25 | uVar31 | uVar26;
  uVar27 = (*(uint *)(lVar30 + 0x1c) & 1) << 0x17;
  *(uint *)((long)hal + 0x35c) =
       uVar8 & 0xff000007 | uVar23 | uVar24 | uVar25 | uVar31 | uVar26 | uVar27;
  *(uint *)((long)hal + 0x35c) =
       uVar8 & 0xfe000007 | uVar23 | uVar24 | uVar25 | uVar31 | uVar26 | uVar27 |
       (*(uint *)(lVar30 + 0x38) & 1) << 0x18;
  uVar8 = (*(uint *)((long)hal + 0x360) & 0xfffffffc) + (uint)(*(int *)(lVar1 + 0x2c) == 2) * 2;
  *(uint *)((long)hal + 0x360) = uVar8;
  uVar8 = (uVar8 & 0xfffff802) + (*(uint *)(lVar1 + 0x30) & 0xff) * 4;
  *(uint *)((long)hal + 0x360) = uVar8;
  uVar23 = (*(uint *)(lVar1 + 0x38) & 1) << 0xb;
  *(uint *)((long)hal + 0x360) = uVar8 & 0xfffff3fe | uVar23;
  uVar24 = (*(uint *)(lVar1 + 0x40) & 3) << 0xc;
  *(uint *)((long)hal + 0x360) = uVar8 & 0xffffc3fe | uVar23 | uVar24;
  *(uint *)((long)hal + 0x360) = uVar8 & 0xc3fe | uVar23 | uVar24 | *(int *)(lVar1 + 0x34) << 0x10;
  uVar8 = 0xffff;
  if (*(int *)(lVar1 + 0x2c) == 2) {
    uVar8 = (uint)*(ushort *)(lVar1 + 0x6c);
  }
  *(short *)((long)hal + 0x364) = (short)uVar8;
  *(uint *)((long)hal + 0x364) = *(int *)(lVar1 + 0x74) << 0x10 | uVar8;
  uVar23 = (*(uint *)(lVar1 + 0x44) & 3) << 0xb;
  uVar8 = *(uint *)((long)hal + 0x368);
  *(uint *)((long)hal + 0x368) = uVar8 & 0xffffe7ff | uVar23;
  *(uint *)((long)hal + 0x368) = uVar8 & 0xffffe07f | uVar23 | (*(uint *)(lVar1 + 0x48) & 0xf) << 7;
  h264e_reorder_rd_rewind(*(H264eReorderInfo **)(lVar1 + 0x58));
  MVar7 = h264e_reorder_rd_op(*(H264eReorderInfo **)(lVar1 + 0x58),(H264eRplmo *)&local_80);
  VVar28 = *(Vepu541Fmt *)((long)hal + 0x368);
  if (MVar7 == MPP_OK) {
    *(Vepu541Fmt *)((long)hal + 0x368) = VVar28 | VEPU541_FMT_YUV422SP;
    *(Vepu541Fmt *)((long)hal + 0x368) =
         VVar28 & ~VEPU541_FMT_NONE | VEPU541_FMT_YUV422SP | local_80.format & VEPU541_FMT_NONE;
    RVar11 = local_80.alpha_swap;
    if ((local_80.format < VEPU541_FMT_BGR565) ||
       (RVar11 = local_80.rbuv_swap, local_80.format == VEPU541_FMT_BGR565)) {
      VVar28 = VVar28 & 0xfffc | VEPU541_FMT_YUV422SP | local_80.format & VEPU541_FMT_NONE |
               RVar11 << 0x10;
      goto LAB_0021f1f2;
    }
    _mpp_log_l(2,"hal_h264e_vepu541","invalid modification_of_pic_nums_idc %d\n",
               "setup_vepu541_codec");
  }
  else {
    VVar28 = VVar28 & 0xfff8;
LAB_0021f1f2:
    *(Vepu541Fmt *)((long)hal + 0x368) = VVar28;
  }
  *(uint *)((long)hal + 0x36c) = *(uint *)((long)hal + 0x36c) & 0xe0000000;
  *(undefined4 *)((long)hal + 0x370) = 0;
  *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xfffff000;
  h264e_marking_rd_rewind(*(H264eMarkingInfo **)(lVar1 + 0x60));
  if (*(int *)(lVar1 + 0x2c) == 2) {
    uVar8 = *(uint *)((long)hal + 0x36c);
    uVar23 = *(uint *)(lVar1 + 0x7c) & 1;
    *(uint *)((long)hal + 0x36c) = uVar8 & 0xfffffffe | uVar23;
    *(uint *)((long)hal + 0x36c) = (uVar8 & 0xfffffffc | uVar23) + (*(uint *)(lVar1 + 0x80) & 1) * 2
    ;
  }
  else {
    RVar14 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar1 + 0x60));
    if (RVar14 == 0) {
      *(byte *)((long)hal + 0x36c) = *(byte *)((long)hal + 0x36c) | 4;
      h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar1 + 0x60),(H264eMmco *)&local_80);
      uVar23 = 0;
      uVar8 = 0;
      RVar11 = local_80.alpha_swap;
      switch(local_80.format) {
      case VEPU541_FMT_BGR888:
        uVar24 = 0x10;
        break;
      case VEPU541_FMT_BGR565:
        uVar24 = 0x20;
        RVar11 = local_80.rbuv_swap;
        break;
      case VEPU541_FMT_NONE:
        uVar8 = local_80.src_range & 0xf;
        uVar24 = 0x30;
        break;
      case VEPU541_FMT_YUV422SP:
        uVar24 = 0x40;
        uVar8 = uVar23;
        RVar11 = local_80.src_endian;
        break;
      case VEPU541_FMT_YUV422P:
        uVar24 = 0x50;
        RVar11 = 0;
        uVar8 = uVar23;
        break;
      case VEPU541_FMT_YUV420SP:
        uVar24 = 0x60;
        uVar8 = uVar23;
        RVar11 = local_80.src_range;
        break;
      default:
        uVar24 = 0;
        _mpp_log_l(2,"hal_h264e_vepu541","unsupported mmco 0 %d\n","setup_vepu541_codec");
        uVar8 = 0;
        RVar11 = 0;
      }
      *(RK_U32 *)((long)hal + 0x36c) =
           (RVar11 & 0xffff) << 7 | uVar24 | *(uint *)((long)hal + 0x36c) & 0xff80000f;
      *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xfffffff0 | uVar8;
      RVar14 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar1 + 0x60));
      if (RVar14 == 0) {
        h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar1 + 0x60),(H264eMmco *)&local_80);
        uVar23 = 0;
        uVar8 = 0;
        uVar22 = (undefined2)local_80.alpha_swap;
        switch(local_80.format) {
        case VEPU541_FMT_BGR888:
          uVar24 = 0x800000;
          break;
        case VEPU541_FMT_BGR565:
          uVar24 = 0x1000000;
          uVar22 = (undefined2)local_80.rbuv_swap;
          break;
        case VEPU541_FMT_NONE:
          uVar8 = (local_80.src_range & 0xf) << 4;
          uVar24 = 0x1800000;
          break;
        case VEPU541_FMT_YUV422SP:
          uVar24 = 0x2000000;
          uVar8 = uVar23;
          uVar22 = (undefined2)local_80.src_endian;
          break;
        case VEPU541_FMT_YUV422P:
          uVar24 = 0x2800000;
          uVar22 = 0;
          uVar8 = uVar23;
          break;
        case VEPU541_FMT_YUV420SP:
          uVar24 = 0x3000000;
          uVar8 = uVar23;
          uVar22 = (undefined2)local_80.src_range;
          break;
        default:
          uVar24 = 0;
          _mpp_log_l(2,"hal_h264e_vepu541","unsupported mmco 0 %d\n","setup_vepu541_codec");
          uVar8 = 0;
          uVar22 = 0;
        }
        *(uint *)((long)hal + 0x36c) = *(uint *)((long)hal + 0x36c) & 0xfc7fffff | uVar24;
        *(undefined2 *)((long)hal + 0x370) = uVar22;
        *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xffffff0f | uVar8;
        RVar14 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar1 + 0x60));
        if (RVar14 == 0) {
          h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar1 + 0x60),(H264eMmco *)&local_80);
          uVar23 = 0;
          uVar8 = 0;
          switch(local_80.format) {
          case VEPU541_FMT_BGR888:
            uVar24 = 0x4000000;
            local_80.src_range._0_2_ = (undefined2)local_80.alpha_swap;
            break;
          case VEPU541_FMT_BGR565:
            uVar24 = 0x8000000;
            local_80.src_range._0_2_ = (undefined2)local_80.rbuv_swap;
            break;
          case VEPU541_FMT_NONE:
            uVar8 = (local_80.src_range & 0xf) << 8;
            uVar24 = 0xc000000;
            local_80.src_range._0_2_ = (undefined2)local_80.alpha_swap;
            break;
          case VEPU541_FMT_YUV422SP:
            uVar24 = 0x10000000;
            uVar8 = uVar23;
            local_80.src_range._0_2_ = (undefined2)local_80.src_endian;
            break;
          case VEPU541_FMT_YUV422P:
            uVar24 = 0x14000000;
            local_80.src_range._0_2_ = 0;
            uVar8 = uVar23;
            break;
          case VEPU541_FMT_YUV420SP:
            uVar24 = 0x18000000;
            uVar8 = uVar23;
            break;
          default:
            uVar24 = 0;
            _mpp_log_l(2,"hal_h264e_vepu541","unsupported mmco 0 %d\n","setup_vepu541_codec");
            local_80.src_range._0_2_ = 0;
            uVar8 = 0;
          }
          *(uint *)((long)hal + 0x36c) = *(uint *)((long)hal + 0x36c) & 0xe3ffffff | uVar24;
          *(undefined2 *)((long)hal + 0x372) = (undefined2)local_80.src_range;
          *(uint *)((long)hal + 0x380) = *(uint *)((long)hal + 0x380) & 0xfffff0ff | uVar8;
        }
      }
    }
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_codec");
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_rdo_pred");
  }
  bVar6 = *(byte *)((long)hal + 0x21c) & 0xf8;
  if (*(int *)(lVar1 + 0x2c) == 2) {
    *(byte *)((long)hal + 0x21c) = bVar6;
LAB_0021f5c7:
    pRVar32 = h264e_klut_weight;
  }
  else {
    *(byte *)((long)hal + 0x21c) = bVar6 | 3;
    if (*(int *)(lVar36 + 0x1864) != 1) goto LAB_0021f5c7;
    pRVar32 = h264e_klut_weight + 3;
  }
  pRVar33 = (RK_U32 *)((long)hal + 0x220);
  for (lVar29 = 0x18; lVar29 != 0; lVar29 = lVar29 + -1) {
    *pRVar33 = *pRVar32;
    pRVar32 = pRVar32 + (ulong)bVar40 * -2 + 1;
    pRVar33 = pRVar33 + (ulong)bVar40 * -2 + 1;
  }
  bVar39 = *(int *)(lVar36 + 0x1864) == 1;
  uVar8 = 0x9c509c5;
  if (bVar39) {
    uVar8 = 0x3f0009;
  }
  uVar23 = 2;
  if (bVar39) {
    uVar23 = 0x80300;
  }
  *(uint *)((long)hal + 0x34c) = uVar8 | *(uint *)((long)hal + 0x34c) & 0xf000f000;
  *(uint *)((long)hal + 0x350) = *(uint *)((long)hal + 0x350) & 0xfff7e01d | uVar23;
  iVar9 = 0;
  uVar8 = 0;
  if (*piVar5 == 0x42) {
    uVar8 = (uint)(piVar5[7] < 0x1f);
  }
  uVar23 = *(uint *)((long)hal + 0x350);
  *(uint *)((long)hal + 0x350) = uVar23 & 0xfffffffe | uVar8;
  if (*piVar5 < 0x4d) {
    iVar9 = (uint)(*(int *)(lVar30 + 8) == 0) << 3;
  }
  uVar8 = iVar9 + (uVar23 & 0xffffdfe6 | uVar8) + 0x2010;
  *(uint *)((long)hal + 0x350) = uVar8;
  uVar23 = (*(uint *)(lVar30 + 0x48) & 1) << 0xe;
  *(uint *)((long)hal + 0x350) = uVar8 & 0xffffbfff | uVar23;
  *(uint *)((long)hal + 0x350) =
       (uVar8 & 0x7fc83fff | uVar23) + (*(uint *)(lVar30 + 0x48) & 3) * 0x100000 + 0x8000;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_rdo_pred");
  }
  pEVar3 = task->rc_task;
  iVar9 = piVar5[0xf];
  uVar8 = (pEVar3->info).bit_target;
  uVar23 = (pEVar3->info).quality_target;
  uVar24 = (pEVar3->info).quality_min;
  uVar25 = (pEVar3->info).quality_max;
  uVar31 = (int)(uVar8 << 4) / (piVar5[0x10] * iVar9);
  if ((hal_h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","bittarget %d qp [%d %d %d]\n","setup_vepu541_rc_base",
               (ulong)uVar8,(ulong)uVar24,uVar23,uVar25);
  }
  uVar8 = 0x50000;
  if ((int)uVar31 < 0x100000) {
    uVar8 = uVar31;
  }
  iVar10 = (int)(uVar8 * iVar9) >> 4;
  iVar13 = iVar10 * 5;
  iVar10 = iVar10 * 5 + 0xf;
  if (-1 < iVar13) {
    iVar10 = iVar13;
  }
  iVar10 = iVar10 >> 4;
  uVar31 = -iVar10;
  if (((byte)hal_h264e_debug & 2) != 0) {
    local_58 = (ulong)uVar31;
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_rc_base");
    uVar31 = (uint)local_58;
  }
  *(uint *)((long)hal + 0x1ec) = *(uint *)((long)hal + 0x1ec) & 0xffffc0ff | (uVar23 & 0x3f) << 8;
  *(uint *)((long)hal + 0x280) = (*(uint *)((long)hal + 0x280) & 0xfff8) + iVar9 * 0x10000 + 3;
  uVar25 = uVar25 & 0x3f;
  uVar23 = uVar24 & 0x3f;
  *(uint *)((long)hal + 0x284) =
       uVar24 << 0x1a |
       uVar25 << 0x14 |
       (*(uint *)(lVar36 + 0x17c + (ulong)(*(int *)(lVar1 + 0x2c) == 2) * 4) & 0xf) << 0x10 |
       (uint)*(ushort *)((long)hal + 0x284);
  *(uint *)((long)hal + 0x288) = *(uint *)((long)hal + 0x288) & 0xfff00000 | uVar8 & 0xfffff;
  *(uint *)((long)hal + 0x28c) = *(uint *)((long)hal + 0x28c) & 0xfe000000 | 0x2083fe;
  *(uint *)((long)hal + 0x290) = *(uint *)((long)hal + 0x290) & 0xfff00000;
  *(uint *)((long)hal + 0x294) = uVar31 * 2;
  *(uint *)((long)hal + 0x298) = uVar31;
  *(int *)((long)hal + 0x29c) = iVar10;
  *(int *)((long)hal + 0x2a0) = iVar10 * 2;
  *(undefined4 *)((long)hal + 0x2a4) = 0x7fffffff;
  *(undefined4 *)((long)hal + 0x2a8) = 0x7fffffff;
  *(undefined4 *)((long)hal + 0x2ac) = 0x7fffffff;
  *(undefined4 *)((long)hal + 0x2b0) = 0x7fffffff;
  *(undefined4 *)((long)hal + 0x2b4) = 0x7fffffff;
  *(uint *)((long)hal + 0x2b8) =
       *(uint *)((long)hal + 0x2b8) & 0xc0000000 | uVar23 | uVar23 << 0xc | uVar23 << 0x18 |
       uVar25 << 6 | uVar25 << 0x12;
  *(uint *)((long)hal + 700) =
       uVar25 << 0x18 |
       uVar23 << 0x12 | uVar25 << 0xc | uVar23 << 6 | *(uint *)((long)hal + 700) & 0xc0000000 |
       uVar25;
  *(uint *)((long)hal + 0x2c0) =
       *(uint *)((long)hal + 0x2c0) & 0xc0000000 | uVar23 | uVar23 << 0xc | uVar23 << 0x18 |
       uVar25 << 6 | uVar25 << 0x12;
  *(uint *)((long)hal + 0x2c4) = (*(uint *)((long)hal + 0x2c4) & 0x3fffffc0) + uVar25 + 0x40000000;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_rc_base");
  }
  pvVar4 = *(MppDev *)((long)hal + 8);
  s = task->packet;
  frame = task->frame;
  pvVar17 = mpp_frame_get_buffer(frame);
  pvVar34 = task->output;
  local_34 = mpp_frame_get_fmt(frame);
  RVar11 = mpp_frame_get_hor_stride(frame);
  RVar12 = mpp_frame_get_ver_stride(frame);
  local_48 = CONCAT44(extraout_var,RVar12);
  iVar9 = mpp_buffer_get_fd_with_caller(pvVar17,"setup_vepu541_io_buf");
  sVar18 = mpp_packet_get_length(s);
  local_58 = mpp_buffer_get_size_with_caller(pvVar34,"setup_vepu541_io_buf");
  iVar13 = mpp_buffer_get_fd_with_caller(pvVar34,"setup_vepu541_io_buf");
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_io_buf");
  }
  *(int *)((long)hal + 0x2d0) = iVar9;
  *(int *)((long)hal + 0x2d4) = iVar9;
  *(int *)((long)hal + 0x2d8) = iVar9;
  *(int *)((long)hal + 0x308) = iVar13;
  *(int *)((long)hal + 0x30c) = iVar13;
  *(int *)((long)hal + 0x310) = iVar13;
  *(int *)((long)hal + 0x304) = iVar13;
  if ((local_34 & 0xf00000) != MPP_FMT_YUV420SP) {
    offset = mpp_frame_get_fbc_offset(frame);
    RVar12 = 0;
    goto LAB_0021fb38;
  }
  offset = 0;
  RVar12 = 0;
  if (MPP_FMT_AYUV1BPP < (local_34 & 0xfffc) || (local_34 & 0xf0000) != MPP_FMT_YUV420SP)
  goto LAB_0021fb38;
  vepu541_set_fmt(&local_80,local_34);
  iVar9 = (int)local_48;
  switch(local_80.format) {
  case VEPU541_FMT_YUV422SP:
  case VEPU541_FMT_YUV420SP:
    offset = iVar9 * RVar11;
    RVar12 = offset;
    break;
  case VEPU541_FMT_YUV422P:
    RVar12 = (int)(iVar9 * RVar11 * 3) / 2;
    goto LAB_0021fb2f;
  case VEPU541_FMT_YUV420P:
    iVar13 = iVar9 * RVar11 * 5;
    iVar10 = iVar9 * RVar11 * 5 + 3;
    if (-1 < iVar13) {
      iVar10 = iVar13;
    }
    RVar12 = iVar10 >> 2;
LAB_0021fb2f:
    offset = iVar9 * RVar11;
    break;
  default:
    offset = 0;
    RVar12 = 0;
  }
LAB_0021fb38:
  mpp_dev_set_reg_offset(pvVar4,0x47,offset);
  mpp_dev_set_reg_offset(pvVar4,0x48,RVar12);
  mpp_dev_set_reg_offset(pvVar4,0x53,(RK_U32)local_58);
  mpp_dev_set_reg_offset(pvVar4,0x56,(RK_U32)sVar18);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_io_buf");
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_roi");
  }
  if (*(undefined8 **)((long)hal + 0x160) == (undefined8 *)0x0) {
    pvVar34 = *(MppBuffer *)((long)hal + 0x180);
    if (pvVar34 != (MppBuffer)0x0) {
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
      goto LAB_0021fc02;
    }
    roi = *(MppEncROICfg **)((long)hal + 0x158);
    if (((roi == (MppEncROICfg *)0x0) || (roi->number == 0)) ||
       (roi->regions == (MppEncROIRegion *)0x0)) {
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) & 0xfd;
      *(undefined4 *)((long)hal + 0x2dc) = 0;
    }
    else {
      iVar9 = *(int *)(*(long *)((long)hal + 0x38) + 0x3c) << 4;
      iVar13 = *(int *)(*(long *)((long)hal + 0x38) + 0x40) << 4;
      RVar14 = vepu541_get_roi_buf_size(iVar9,iVar13);
      buffer = (MppBuffer *)((long)hal + 0x170);
      pvVar34 = *(MppBuffer *)((long)hal + 0x170);
      if ((pvVar34 == (MppBuffer)0x0) || (RVar14 != *(int *)((long)hal + 0x178))) {
        group = (MppBufferGroup *)((long)hal + 0x168);
        if (*(long *)((long)hal + 0x168) == 0) {
          mpp_buffer_group_get
                    (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h264e_vepu541",
                     "setup_vepu541_roi");
        }
        else if (RVar14 != *(int *)((long)hal + 0x178)) {
          if (pvVar34 != (MppBuffer)0x0) {
            mpp_buffer_put_with_caller(pvVar34,"setup_vepu541_roi");
            *buffer = (MppBuffer)0x0;
          }
          mpp_buffer_group_clear(*group);
        }
        if ((*group == (MppBufferGroup)0x0) &&
           (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "ctx->roi_grp","setup_vepu541_roi",0x44e), (mpp_debug._3_1_ & 0x10) != 0))
        goto LAB_00220f56;
        if (*buffer == (MppBuffer)0x0) {
          mpp_buffer_get_with_tag
                    (*group,buffer,(long)RVar14,"hal_h264e_vepu541","setup_vepu541_roi");
        }
        *(RK_S32 *)((long)hal + 0x178) = RVar14;
      }
      if ((*buffer == (MppBuffer)0x0) &&
         (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "ctx->roi_buf","setup_vepu541_roi",0x456), (mpp_debug._3_1_ & 0x10) != 0))
      goto LAB_00220f56;
      iVar10 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_roi");
      pvVar21 = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_roi");
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
      *(int *)((long)hal + 0x2dc) = iVar10;
      vepu541_set_roi(pvVar21,roi,iVar9,iVar13);
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x170),0,"setup_vepu541_roi");
    }
  }
  else {
    *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
    pvVar34 = (MppBuffer)**(undefined8 **)((long)hal + 0x160);
LAB_0021fc02:
    iVar9 = mpp_buffer_get_fd_with_caller(pvVar34,"setup_vepu541_roi");
    *(int *)((long)hal + 0x2dc) = iVar9;
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_roi");
  }
  pvVar4 = *(MppDev *)((long)hal + 8);
  bufs = *(HalBufs *)((long)hal + 0x18);
  lVar30 = *(long *)((long)hal + 0x50);
  RVar11 = *(RK_U32 *)((long)hal + 0x20);
  pHVar19 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar30 + 4));
  pHVar20 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar30 + 8));
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_recn_refr");
  }
  if ((pHVar19 != (HalBuf *)0x0) && (pHVar19->cnt != 0)) {
    pvVar34 = *pHVar19->buf;
    pvVar17 = pHVar19->buf[1];
    iVar9 = mpp_buffer_get_fd_with_caller(pvVar34,"setup_vepu541_recn_refr");
    if (((pvVar34 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu541_recn_refr",0x476), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar17 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu541_recn_refr",0x477), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_00220f56;
    *(int *)((long)hal + 0x2e0) = iVar9;
    *(int *)((long)hal + 0x2e4) = iVar9;
    iVar9 = mpp_buffer_get_fd_with_caller(pvVar17,"setup_vepu541_recn_refr");
    *(int *)((long)hal + 0x2f8) = iVar9;
    mpp_dev_set_reg_offset(pvVar4,0x4b,RVar11);
  }
  if ((pHVar20 != (HalBuf *)0x0) && (pHVar20->cnt != 0)) {
    pvVar34 = *pHVar20->buf;
    pvVar17 = pHVar20->buf[1];
    iVar9 = mpp_buffer_get_fd_with_caller(pvVar34,"setup_vepu541_recn_refr");
    if (((pvVar34 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu541_recn_refr",0x485), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar17 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu541_recn_refr",0x486), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_00220f56;
    *(int *)((long)hal + 0x2e8) = iVar9;
    *(int *)((long)hal + 0x2ec) = iVar9;
    iVar9 = mpp_buffer_get_fd_with_caller(pvVar17,"setup_vepu541_recn_refr");
    *(int *)((long)hal + 0x2fc) = iVar9;
    mpp_dev_set_reg_offset(pvVar4,0x4d,RVar11);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_recn_refr");
  }
  if (task->md_info == (MppBuffer)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = mpp_buffer_get_fd_with_caller(task->md_info,"hal_h264e_vepu541_gen_regs");
  }
  *(int *)((long)hal + 0x300) = iVar9;
  RVar11 = mpp_frame_get_offset_y(task->frame);
  *(uint *)((long)hal + 0x2c8) = *(uint *)((long)hal + 0x2c8) & 0xffffe000 | RVar11 & 0x1fff;
  RVar11 = mpp_frame_get_offset_x(task->frame);
  *(uint *)((long)hal + 0x2c8) =
       *(uint *)((long)hal + 0x2c8) & 0xe000ffff | (RVar11 & 0x1fff) << 0x10;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_split");
  }
  iVar9 = *(int *)(lVar36 + 0xe94);
  if (iVar9 == 2) {
    uVar8 = *(uint *)((long)hal + 0x314);
    *(uint *)((long)hal + 0x314) = uVar8 & 0xffffc000 | 0x2fa3;
    *(uint *)((long)hal + 0x314) =
         (uVar8 & 0xc000 | 0x2fa3) + *(int *)(lVar36 + 0xe98) * 0x10000 + -0x10000;
LAB_0021ffe2:
    *(uint *)((long)hal + 0x318) = *(uint *)((long)hal + 0x318) & 0xfffc0000;
LAB_0021ffec:
    *(byte *)((long)hal + 0x1ef) = *(byte *)((long)hal + 0x1ef) & 0xbf;
  }
  else {
    if (iVar9 == 1) {
      *(uint *)((long)hal + 0x314) = *(uint *)((long)hal + 0x314) & 0xc000 | 0x2fa1;
      *(uint *)((long)hal + 0x318) =
           *(uint *)((long)hal + 0x318) & 0xfffc0000 | *(uint *)(lVar36 + 0xe98) & 0x3ffff;
      goto LAB_0021ffec;
    }
    if (iVar9 == 0) {
      *(uint *)((long)hal + 0x314) = *(uint *)((long)hal + 0x314) & 0xc000;
      goto LAB_0021ffe2;
    }
    _mpp_log_l(4,"hal_h264e_vepu541","invalide slice split mode %d\n","setup_vepu541_split");
  }
  *(undefined4 *)(lVar36 + 0xe90) = 0;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_split");
  }
  if ((*(int *)((long)hal + 0x10) != 0) && (iVar9 = *(int *)(lVar36 + 0xc), 0x780 < iVar9)) {
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu540_force_slice_split");
    }
    *(uint *)((long)hal + 0x314) =
         (*(uint *)((long)hal + 0x314) & 0xc000) + (iVar9 * 0x1000 - 0x1000U & 0xffff0000) + 0x2fa3;
    *(uint *)((long)hal + 0x318) = *(uint *)((long)hal + 0x318) & 0xfffc0000;
    *(byte *)((long)hal + 0x1ef) = *(byte *)((long)hal + 0x1ef) & 0xbf;
    *(byte *)((long)hal + 0x217) = *(byte *)((long)hal + 0x217) & 0x7f;
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu540_force_slice_split");
    }
  }
  iVar13 = *(int *)((long)hal + 0x10);
  iVar10 = local_50[7];
  iVar15 = local_50[0xf];
  iVar9 = iVar15 * 0x10 + 0x3f;
  iVar38 = iVar15 * 0x10 + 0x7e;
  if (-1 < iVar9) {
    iVar38 = iVar9;
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_me");
  }
  uVar8 = 0xc;
  if (iVar10 < 0x14) {
    if ((iVar10 - 0xbU < 3) || (iVar10 != 10)) {
LAB_0022016d:
      uVar8 = 0x1c;
    }
  }
  else if (iVar10 != 99) goto LAB_0022016d;
  uVar23 = local_50[0xf] * 2 + 1;
  uVar24 = 0xb;
  if ((int)uVar23 < 0x2c) {
    uVar24 = local_50[0xf] * 2 + 4;
    if (-1 < (int)uVar23) {
      uVar24 = uVar23;
    }
    uVar24 = uVar24 >> 2 & 0xf;
  }
  iVar38 = iVar38 >> 6;
  uVar25 = uVar8 >> 2;
  uVar31 = local_50[0x10] * 0x10 + 0x3fU & 0xffffffc0;
  uVar23 = uVar31 + 0x7f;
  if (-1 < (int)uVar31) {
    uVar23 = uVar31;
  }
  iVar9 = (int)uVar23 >> 7;
  uVar23 = iVar9 << 4;
  if (uVar25 == iVar9 * 4 || SBORROW4(uVar25,iVar9 * 4) != (int)(uVar25 + iVar9 * -4) < 0) {
    uVar23 = uVar8;
  }
  uVar23 = uVar23 << 2;
  *(uint *)((long)hal + 0x31c) =
       uVar24 + (uVar23 & 0xf0 | *(uint *)((long)hal + 0x31c) & 0xc000) + 0x2f00;
  uVar8 = *(uint *)((long)hal + 800) | 0x505;
  if (*(int *)(lVar1 + 0x2c) == 2) {
    uVar8 = *(uint *)((long)hal + 800) & 0xfff00000;
  }
  *(uint *)((long)hal + 800) = uVar8 & 0xfff00505 | 0xa0000;
  if (iVar13 == 0) {
    if (iVar15 < 0xe1) {
      if (iVar15 < 0xc5) {
        if (iVar15 < 0xb1) {
          if (iVar15 < 0xa1) {
            if (iVar15 < 0x95) {
              if (iVar15 < 0x89) {
                if (iVar15 < 0x81) {
                  if (iVar15 < 0x75) {
                    uVar8 = *(uint *)((long)hal + 0x324) & 0xffff07ff;
                    if (iVar15 < 0x71) {
                      uVar8 = uVar8 | 0x8800;
                    }
                    else {
                      uVar8 = uVar8 | 0x8000;
                    }
                  }
                  else {
                    uVar8 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x7800;
                  }
                }
                else {
                  uVar8 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x7000;
                }
              }
              else {
                uVar8 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x6800;
              }
            }
            else {
              uVar8 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x6000;
            }
          }
          else {
            uVar8 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x5800;
          }
        }
        else {
          uVar8 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x5000;
        }
      }
      else {
        uVar8 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x4800;
      }
    }
    else {
      uVar8 = *(uint *)((long)hal + 0x324) & 0xffff07ff | 0x4000;
    }
    *(uint *)((long)hal + 0x324) = uVar8;
    uVar23 = uVar23 >> 3 & 0x1e;
    uVar24 = uVar24 * 4 + 0xf >> 3 | 1;
    uVar8 = *(uint *)((long)hal + 0x324);
    uVar25 = uVar8 >> 0xb & 0x1f;
    if (uVar23 + 1 < uVar25) {
      uVar8 = uVar8 & 0xfffff800 | uVar23 * iVar38 + uVar24 & 0x7ff;
    }
    else {
      uVar8 = uVar8 & 0xfffff800 | (uVar25 - 1) * iVar38 + uVar24 & 0x7ff;
    }
    *(uint *)((long)hal + 0x324) = uVar8;
  }
  else {
    uVar26 = (*(uint *)((long)hal + 0x1e8) & 0x1ff) * 8 + 0x47 >> 6;
    iVar9 = uVar26 * 4 + -0x1c;
    uVar8 = *(uint *)((long)hal + 0x324);
    *(uint *)((long)hal + 0x324) = uVar8 & 0xfc03ffff | uVar26 << 0x12;
    iVar13 = uVar26 * -4 + 0x1f8;
    uVar25 = 0;
    uVar31 = 0x1dc;
    do {
      uVar27 = uVar25;
      uVar25 = uVar27 + 1;
      iVar13 = iVar13 + iVar9;
      if (0x10 < uVar25) break;
      bVar39 = uVar31 < 0x510;
      uVar31 = uVar31 + iVar9;
    } while (bVar39);
    if (iVar13 < 0x511) {
      uVar27 = uVar25;
    }
    uVar24 = uVar24 + 3 >> 1 | 1;
    uVar25 = uVar23 >> 3 & 0x1e;
    uVar23 = uVar27 & 0x1f;
    if (uVar25 < (uVar27 & 0x1f)) {
      uVar23 = uVar25 + 1;
    }
    uVar25 = iVar38 * 2;
    if ((int)uVar24 <= iVar38) {
      uVar25 = uVar24;
    }
    *(uint *)((long)hal + 0x324) =
         (uVar23 - 1) * iVar38 + uVar25 & 0x7ff |
         uVar8 & 0xfc030000 | uVar26 << 0x12 | (uVar27 & 0x1f) << 0xb;
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_me");
  }
  uVar35 = (pEVar2->frm).val;
  if ((uVar35 >> 0x26 & 1) != 0) {
    local_50 = (int *)CONCAT44(local_50._4_4_,
                               (int)((long)(uVar35 >> 0x30) % (long)*(int *)(lVar36 + 0xc4)));
    uVar8 = *(uint *)(*(long *)((long)hal + 0x38) + 0x3c);
    uVar23 = *(uint *)(*(long *)((long)hal + 0x38) + 0x40);
    iVar9 = *(int *)(*hal + 0x16c);
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_intra_refresh");
    }
    if (*(int *)(*hal + 0x164) == 0) {
      uVar8 = 0xfffffffa;
    }
    else {
      iVar10 = uVar8 << 4;
      iVar13 = uVar23 << 4;
      RVar14 = vepu541_get_roi_buf_size(iVar10,iVar13);
      if (*(int *)((long)hal + 0x178) < RVar14) {
        if (*(long *)((long)hal + 0x168) == 0) {
          mpp_buffer_group_get
                    ((MppBufferGroup *)((long)hal + 0x168),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                     "hal_h264e_vepu541","setup_vepu541_intra_refresh");
        }
        if (*(MppBuffer *)((long)hal + 0x170) != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller
                    (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_intra_refresh");
        }
        mpp_buffer_get_with_tag
                  (*(MppBufferGroup *)((long)hal + 0x168),(MppBuffer *)((long)hal + 0x170),
                   (long)RVar14,"hal_h264e_vepu541","setup_vepu541_intra_refresh");
        *(RK_S32 *)((long)hal + 0x178) = RVar14;
      }
      if ((*(long *)((long)hal + 0x170) == 0) &&
         (_mpp_log_l(2,"hal_h264e_vepu541","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "ctx->roi_buf","setup_vepu541_intra_refresh",0x3ed),
         (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_00220f56:
        abort();
      }
      iVar38 = ((uVar23 & 0xfffffff) + 3 & 0xfffffffc) * ((uVar8 & 0xfffffff) + 3 & 0xfffffffc);
      iVar15 = mpp_buffer_get_fd_with_caller
                         (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_intra_refresh");
      pvVar21 = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x170),"setup_vepu541_intra_refresh");
      if (iVar38 != 0) {
        lVar30 = 0;
        do {
          *(undefined2 *)((long)pvVar21 + lVar30 * 2) = 0x80;
          lVar30 = lVar30 + 1;
        } while (iVar38 != (int)lVar30);
      }
      region = (MppEncROIRegion *)mpp_osal_calloc("setup_vepu541_intra_refresh",0x10);
      uVar8 = 0;
      if (region == (MppEncROIRegion *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu541","Failed to calloc for MppEncROIRegion !\n",
                   "setup_vepu541_intra_refresh");
        uVar8 = 0xfffffffc;
      }
      lVar30 = *hal;
      iVar38 = *(int *)(lVar30 + 0x168);
      sVar37 = (short)iVar9;
      if (iVar38 == 1) {
        region->y = 0;
        region->h = (RK_U16)iVar13;
        if ((int)local_50 == 0) {
          region->x = 0;
          sVar37 = (short)(iVar9 << 4);
        }
        else {
          region->x = (short)local_50 * sVar37 * 0x10 - 0x20;
          sVar37 = sVar37 * 0x10 + 0x20;
        }
        uVar24 = 1;
        uVar23 = 0xfffffff0;
        lVar29 = 4;
LAB_00220939:
        *(short *)((long)&region->x + lVar29) = sVar37;
        *(uint *)((long)hal + 0x31c) = uVar23 & *(uint *)((long)hal + 0x31c) | uVar24;
      }
      else if (iVar38 == 0) {
        region->x = 0;
        region->w = (RK_U16)iVar10;
        if ((int)local_50 == 0) {
          region->y = 0;
          sVar37 = (short)(iVar9 << 4);
        }
        else {
          region->y = (short)local_50 * sVar37 * 0x10 - 0x20;
          sVar37 = sVar37 * 0x10 + 0x20;
        }
        uVar24 = 0x10;
        uVar23 = 0xffffff0f;
        lVar29 = 6;
        goto LAB_00220939;
      }
      region->intra = 1;
      region->quality = -*(short *)(lVar30 + 0x124);
      region->qp_area_idx = 1;
      region->area_map_en = '\x01';
      region->abs_qp_en = '\0';
      *(byte *)((long)hal + 0x1ec) = *(byte *)((long)hal + 0x1ec) | 2;
      *(int *)((long)hal + 0x2dc) = iVar15;
      vepu541_set_one_roi(pvVar21,region,iVar10,iVar13);
      mpp_osal_free("setup_vepu541_intra_refresh",region);
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x170),0,"setup_vepu541_intra_refresh");
    }
    if (((byte)hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","leave, ret %d\n","setup_vepu541_intra_refresh",(ulong)uVar8)
      ;
    }
  }
  if (*(int *)((long)hal + 0x10) == 0) {
    vepu541_set_osd((Vepu541OsdCfg *)((long)hal + 0x188));
  }
  else {
    vepu540_set_osd((Vepu541OsdCfg *)((long)hal + 0x188));
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu541_l2");
  }
  memset((void *)((long)hal + 0x500),0,0x30c);
  *(undefined8 *)((long)hal + 0x500) = 0x24000900040001;
  *(undefined8 *)((long)hal + 0x508) = 0x24000900040001;
  *(undefined8 *)((long)hal + 0x510) = 0x24000900040001;
  *(undefined8 *)((long)hal + 0x51c) = 0x30283c3030283c30;
  *(undefined8 *)((long)hal + 0x524) = 0x201c2a2430283c30;
  if (*(int *)(lVar36 + 0x1864) == 1) {
    *(undefined4 *)((long)hal + 0x518) = 0;
    *(uint *)((long)hal + 0x800) = *(uint *)((long)hal + 0x800) & 0xffffffc0 | 3;
    uVar8 = *(uint *)((long)hal + 0x52c) & 0xfffffc00;
    if (*(int *)(lVar1 + 0x2c) != 2) {
      *(uint *)((long)hal + 0x52c) = uVar8 | 0x247;
      uVar8 = 0x202020;
      uVar24 = 0x171b1c;
      uVar25 = 0x51;
      uVar23 = 0x171b1c;
      goto LAB_00220b3b;
    }
    *(uint *)((long)hal + 0x52c) = uVar8 | 0x2ab;
    uVar8 = 0x202020;
  }
  else {
    *(undefined4 *)((long)hal + 0x518) = 0x9c5;
    *(byte *)((long)hal + 0x800) = *(byte *)((long)hal + 0x800) & 0xc0;
    uVar8 = *(uint *)((long)hal + 0x52c) & 0xfffffc00;
    if (*(int *)(lVar1 + 0x2c) != 2) {
      *(uint *)((long)hal + 0x52c) = uVar8 | 0x247;
      uVar8 = 0x141414;
      uVar24 = 0x101112;
      uVar25 = 0x51;
      uVar23 = 0x101112;
      goto LAB_00220b3b;
    }
    *(uint *)((long)hal + 0x52c) = uVar8 | 0x2ab;
    uVar8 = 0x141414;
  }
  uVar23 = 0x101214;
  uVar24 = 0x101010;
  uVar25 = 0x24;
LAB_00220b3b:
  *(uint *)((long)hal + 0x534) = *(uint *)((long)hal + 0x534) & 0xfffff000 | uVar25;
  *(uint *)((long)hal + 0x538) = (uint)*(byte *)((long)hal + 0x53b) << 0x18 | uVar24;
  *(uint *)((long)hal + 0x53c) = (uint)*(byte *)((long)hal + 0x53f) << 0x18 | uVar8;
  *(uint *)((long)hal + 0x540) = (uint)*(byte *)((long)hal + 0x543) << 0x18 | uVar23;
  uVar8 = *(uint *)((long)hal + 0x52c);
  *(uint *)((long)hal + 0x52c) = uVar8 & 0xfff003ff | 0x2ac00;
  if (*(int *)(lVar36 + 0x18c) != 0) {
    uVar23 = *(uint *)(lVar36 + 0x184) & 0x3ff;
    *(uint *)((long)hal + 0x52c) = uVar8 & 0xfff00000 | 0x2ac00 | uVar23;
    *(uint *)((long)hal + 0x52c) =
         uVar8 & 0xfff00000 | uVar23 | (*(uint *)(lVar36 + 0x188) & 0x3ff) << 10;
  }
  *(uint *)((long)hal + 0x530) = *(uint *)((long)hal + 0x530) & 0xf000f000 | 0x40001;
  *(uint *)((long)hal + 0x534) = *(uint *)((long)hal + 0x534) & 0xffc0ffff | 0x2d0000;
  *(undefined8 *)((long)hal + 0x544) = 0x9c4009000400000;
  *(uint *)((long)hal + 0x54c) = *(uint *)((long)hal + 0x54c) & 0xc000c000 | 0x1180050;
  *(uint *)((long)hal + 0x550) = *(uint *)((long)hal + 0x550) & 0xc000c000 | 0xc00090;
  *(uint *)((long)hal + 0x554) = *(uint *)((long)hal + 0x554) & 0xfe00fe00 | 0x18001a;
  *(uint *)((long)hal + 0x558) = *(uint *)((long)hal + 0x558) & 0xfe00fe00 | 0x160013;
  *(uint *)((long)hal + 0x55c) = *(uint *)((long)hal + 0x55c) & 0xfe00fe00 | 0x130013;
  *(uint *)((long)hal + 0x560) = *(uint *)((long)hal + 0x560) & 0xc000c000 | 0xdac0dac;
  *(uint *)((long)hal + 0x564) = *(uint *)((long)hal + 0x564) & 0xc000c000 | 0xdac0000;
  *(uint *)((long)hal + 0x568) = *(uint *)((long)hal + 0x568) & 0xc000c000 | 1000;
  *(undefined4 *)((long)hal + 0x56c) = 0;
  *(undefined4 *)((long)hal + 0x638) = 0;
  memcpy((void *)((long)hal + 0x63c),h264e_lambda_default + 6,0xd0);
  memcpy((void *)((long)hal + 0x70c),h264e_lambda_default + 5,0xd0);
  pvVar21 = local_40;
  *(undefined4 *)((long)hal + 0x7dc) = 0;
  ((RK_S32 *)((long)hal + 0x7e0))[0] = 0;
  ((RK_S32 *)((long)hal + 0x7e0))[1] = 0;
  ((RK_S32 *)((long)hal + 0x7e8))[0] = 0;
  ((RK_S32 *)((long)hal + 0x7e8))[1] = 0;
  if (*(int *)(lVar1 + 0x2c) == 2) {
    lVar30 = 0;
    do {
      *(undefined1 *)((long)hal + lVar30 + 0x7e0) = *(undefined1 *)(lVar36 + 0x198 + lVar30 * 4);
      *(byte *)((long)hal + lVar30 + 0x7f0) = *(byte *)(lVar36 + 0x218 + lVar30 * 4) & 0x3f;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 0x10);
  }
  else {
    lVar30 = 0;
    do {
      *(undefined1 *)((long)hal + lVar30 + 0x7e0) = *(undefined1 *)(lVar36 + 0x1d8 + lVar30 * 4);
      *(byte *)((long)hal + lVar30 + 0x7f0) = *(byte *)(lVar36 + 600 + lVar30 * 4) & 0x3f;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 0x10);
  }
  *(uint *)((long)hal + 0x800) = *(uint *)((long)hal + 0x800) & 0xf000003f | 0xfa000;
  *(uint *)((long)hal + 0x804) = *(uint *)((long)hal + 0x804) & 0xf000f000 | 0x40001;
  *(uint *)((long)hal + 0x808) = *(uint *)((long)hal + 0x808) & 0xfffff000 | 0x31;
  mpp_env_get_u32("dump_l2_reg",&dump_l2_reg,0);
  if (dump_l2_reg != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","L2 reg dump start:\n",(char *)0x0);
    lVar36 = -0x30c;
    do {
      _mpp_log_l(4,"hal_h264e_vepu541","%04x %08x\n",(char *)0x0,(ulong)((int)lVar36 + 0x310),
                 (ulong)*(uint *)((long)hal + lVar36 + 0x80c));
      lVar36 = lVar36 + 4;
    } while (lVar36 != 0);
    _mpp_log_l(4,"hal_h264e_vepu541","L2 reg done\n",(char *)0x0);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu541_l2");
  }
  mpp_env_get_u32("dump_l1_reg",&dump_l1_reg,0);
  if (dump_l1_reg != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","L1 reg dump start:\n",(char *)0x0);
    uVar35 = 0;
    do {
      _mpp_log_l(4,"hal_h264e_vepu541","%04x %08x\n",(char *)0x0,uVar35 & 0xffffffff,
                 (ulong)*(uint *)((long)pvVar21 + uVar35));
      uVar35 = uVar35 + 4;
    } while (uVar35 != 0x1d0);
    _mpp_log_l(4,"hal_h264e_vepu541","L1 reg done\n",(char *)0x0);
  }
  *(int *)((long)hal + 0x14) = *(int *)((long)hal + 0x14) + 1;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_gen_regs",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu541_gen_regs(void *hal, HalEncTask *task)
{
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;
    Vepu541H264eRegSet *regs = &ctx->regs_set;
    MppEncCfgSet *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    MPP_RET ret = MPP_OK;
    EncFrmStatus *frm_status = &task->rc_task->frm;

    hal_h264e_dbg_func("enter %p\n", hal);
    hal_h264e_dbg_detail("frame %d generate regs now", ctx->frms->seq_idx);

    /* register setup */
    memset(regs, 0, sizeof(*regs));

    setup_vepu541_normal(regs, ctx->is_vepu540);
    ret = setup_vepu541_prep(regs, &ctx->cfg->prep, task);
    if (ret)
        return ret;

    setup_vepu541_codec(regs, sps, pps, slice);
    setup_vepu541_rdo_pred(regs, sps, pps, slice, cfg);
    setup_vepu541_rc_base(regs, sps, slice, &cfg->hw, task->rc_task);
    setup_vepu541_io_buf(regs, ctx->dev, task);
    setup_vepu541_roi(regs, ctx);
    setup_vepu541_recn_refr(regs, ctx->dev, ctx->frms, ctx->hw_recn,
                            ctx->pixel_buf_fbc_hdr_size);

    regs->reg082.meiw_addr = task->md_info ? mpp_buffer_get_fd(task->md_info) : 0;

    regs->reg068.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg068.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    setup_vepu541_split(regs, &cfg->split);
    if (ctx->is_vepu540 && prep->width > 1920)
        setup_vepu540_force_slice_split(regs, prep->width);

    setup_vepu541_me(regs, sps, slice, ctx->is_vepu540);

    if (frm_status->is_i_refresh)
        setup_vepu541_intra_refresh(regs, ctx, frm_status->seq_idx % cfg->rc.gop);

    if (ctx->is_vepu540)
        vepu540_set_osd(&ctx->osd_cfg);
    else
        vepu541_set_osd(&ctx->osd_cfg);

    setup_vepu541_l2(&ctx->regs_l2_set, slice, &cfg->hw, cfg);

    mpp_env_get_u32("dump_l1_reg", &dump_l1_reg, 0);

    if (dump_l1_reg) {
        mpp_log("L1 reg dump start:\n");
        RK_U32 *p = (RK_U32 *)regs;
        RK_S32 n = 0x1D0 / sizeof(RK_U32);
        RK_S32 i;

        for (i = 0; i < n; i++)
            mpp_log("%04x %08x\n", i * 4, p[i]);

        mpp_log("L1 reg done\n");
    }

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}